

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O1

ByteArray *
ZXing::DataMatrix::Encode
          (ByteArray *__return_storage_ptr__,wstring *msg,CharacterSet charset,SymbolShape shape,
          int minWidth,int minHeight,int maxWidth,int maxHeight)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  pointer __dest;
  bool bVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  size_type sVar8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uint8_t codeword;
  int iVar9;
  SymbolInfo *pSVar10;
  invalid_argument *piVar11;
  int iVar12;
  int startPos;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  undefined7 in_register_00000011;
  wstring *str;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  ByteArray *__range4;
  uint uVar16;
  int iVar17;
  size_t startpos;
  long lVar18;
  char cVar19;
  byte *pbVar20;
  byte *pbVar21;
  size_t __n;
  int iVar22;
  code **ppcVar23;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str_00;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str_01;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str_02;
  undefined1 auVar24 [12];
  string buffer;
  EncoderContext context;
  _Any_data local_108;
  undefined1 local_f8 [16];
  string local_e8;
  EncoderContext local_c8;
  string local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  ulong local_38;
  
  str = (wstring *)(CONCAT71(in_register_00000011,charset) & 0xffffffff);
  if ((int)CONCAT71(in_register_00000011,charset) == 0) {
    str = (wstring *)0x2;
  }
  local_40 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__;
  TextEncoder::FromUnicode((string *)&local_108,(TextEncoder *)msg,str,(CharacterSet)shape);
  EncoderContext::EncoderContext(&local_c8,(string *)&local_108);
  if ((undefined1 *)local_108._M_unused._0_8_ != local_f8) {
    operator_delete(local_108._M_unused._M_object,(ulong)(local_f8._0_8_ + 1));
  }
  local_c8._maxWidth = maxWidth;
  local_c8._maxHeight = maxHeight;
  local_108._8_8_ = (msg->_M_dataplus)._M_p;
  local_108._M_unused._0_8_ = (undefined8)msg->_M_string_length;
  local_c8._shape = shape;
  local_c8._minWidth = minWidth;
  local_c8._minHeight = minHeight;
  if ((local_108._M_unused._M_object < (pointer)0x8) ||
     (__str._M_str = L"[)>\x1e05\x1d", __str._M_len = 7,
     iVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_108,0,7,
                        __str), iVar9 != 0)) {
LAB_00156cf0:
    local_108._8_8_ = (msg->_M_dataplus)._M_p;
    local_108._M_unused._0_8_ = (undefined8)msg->_M_string_length;
    if ((local_108._M_unused._M_object < (code **)0x8) ||
       (__str_01._M_str = L"[)>\x1e06\x1d", __str_01._M_len = 7,
       iVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_108,0,7,
                          __str_01), iVar9 != 0)) goto LAB_00156d96;
    local_108._8_8_ = (msg->_M_dataplus)._M_p;
    local_108._M_unused._0_8_ = (undefined8)msg->_M_string_length;
    if ((local_108._M_unused._M_object < (code **)0x3) ||
       (__str_02._M_str = L"\x1e\x04", __str_02._M_len = 2,
       iVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_108,
                          (size_type)(local_108._M_unused._M_member_pointer + -2),2,__str_02),
       iVar9 != 0)) goto LAB_00156d96;
    EncoderContext::addCodeword(&local_c8,0xed);
  }
  else {
    local_108._8_8_ = (msg->_M_dataplus)._M_p;
    local_108._M_unused._0_8_ = (undefined8)msg->_M_string_length;
    if ((local_108._M_unused._M_object < (code **)0x3) ||
       (__str_00._M_str = L"\x1e\x04", __str_00._M_len = 2,
       iVar9 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&local_108,
                          (size_type)(local_108._M_unused._M_member_pointer + -2),2,__str_00),
       iVar9 != 0)) goto LAB_00156cf0;
    EncoderContext::addCodeword(&local_c8,0xec);
  }
  local_c8._skipAtEnd = 2;
  local_c8._pos = 7;
LAB_00156d96:
  uVar13 = CONCAT44(local_c8._msg._M_string_length._4_4_,(int)local_c8._msg._M_string_length);
  uVar14 = 0;
  if (local_c8._pos < (int)local_c8._msg._M_string_length - local_c8._skipAtEnd) {
    uVar14 = 0;
    do {
      cVar19 = (char)&local_e8;
      switch(uVar14 & 0xffffffff) {
      case 0:
        startpos = (size_t)local_c8._pos;
        pbVar1 = (byte *)(local_c8._msg._M_dataplus._M_p + startpos);
        lVar18 = (long)(uVar13 - startpos) >> 2;
        pbVar21 = pbVar1;
        if (0 < lVar18) {
          pbVar21 = (byte *)(local_c8._msg._M_dataplus._M_p +
                            startpos + (uVar13 - startpos & 0xfffffffffffffffc));
          lVar18 = lVar18 + 1;
          pbVar20 = (byte *)(local_c8._msg._M_dataplus._M_p + startpos + 1);
          do {
            if (9 < (int)(char)pbVar20[-1] - 0x30U) {
              pbVar20 = pbVar20 + -1;
              goto LAB_0015759a;
            }
            if (9 < (int)(char)*pbVar20 - 0x30U) goto LAB_0015759a;
            if (9 < (int)(char)pbVar20[1] - 0x30U) {
              pbVar20 = pbVar20 + 1;
              goto LAB_0015759a;
            }
            if (9 < (int)(char)pbVar20[2] - 0x30U) {
              pbVar20 = pbVar20 + 2;
              goto LAB_0015759a;
            }
            lVar18 = lVar18 + -1;
            pbVar20 = pbVar20 + 4;
          } while (1 < lVar18);
        }
        pbVar2 = (byte *)(local_c8._msg._M_dataplus._M_p + uVar13);
        lVar18 = (long)pbVar2 - (long)pbVar21;
        if (lVar18 == 1) {
LAB_00156ebb:
          pbVar20 = pbVar2;
          if (9 < (int)(char)*pbVar21 - 0x30U) {
            pbVar20 = pbVar21;
          }
        }
        else {
          pbVar20 = pbVar21;
          if (lVar18 == 2) {
LAB_00156ea6:
            if ((int)(char)*pbVar20 - 0x30U < 10) {
              pbVar21 = pbVar20 + 1;
              goto LAB_00156ebb;
            }
          }
          else {
            pbVar20 = pbVar2;
            if ((lVar18 == 3) && (pbVar20 = pbVar21, (int)(char)*pbVar21 - 0x30U < 10)) {
              pbVar20 = pbVar21 + 1;
              goto LAB_00156ea6;
            }
          }
        }
LAB_0015759a:
        if ((int)pbVar20 - (int)pbVar1 < 2) {
          if (uVar13 <= startpos) goto LAB_001578e7;
          bVar3 = *pbVar1;
          uVar16 = LookAheadTest(&local_c8._msg,startpos,0);
          if (uVar16 == 0) {
            if ((char)bVar3 < '\0') {
              EncoderContext::addCodeword(&local_c8,0xeb);
              EncoderContext::addCodeword(&local_c8,bVar3 + 0x81);
            }
            else {
              EncoderContext::addCodeword(&local_c8,bVar3 + 1);
            }
            local_c8._pos = local_c8._pos + 1;
          }
          else {
            EncoderContext::addCodeword(&local_c8,*(uint8_t *)((long)&LATCHES + (ulong)uVar16));
            local_c8._newEncoding = uVar16;
          }
        }
        else {
          if ((uVar13 <= startpos) || (uVar13 <= (long)local_c8._pos + 1U)) {
LAB_001578e7:
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          }
          codeword = *pbVar1 * '\n' + local_c8._msg._M_dataplus._M_p[(long)local_c8._pos + 1U] + 'r'
          ;
          if (9 < (byte)local_c8._msg._M_dataplus._M_p[(long)local_c8._pos + 1U] - 0x30) {
            codeword = '?';
          }
          if (9 < *pbVar1 - 0x30) {
            codeword = '?';
          }
          EncoderContext::addCodeword(&local_c8,codeword);
          local_c8._pos = local_c8._pos + 2;
        }
        break;
      case 1:
        local_108._8_8_ = (code **)0x0;
        local_108._M_unused._M_object = C40Encoder::EncodeChar;
        local_f8._8_8_ =
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_invoke;
        local_f8._0_8_ =
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_manager;
        C40Encoder::EncodeC40
                  (&local_c8,
                   (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_108,1);
        if ((code *)local_f8._0_8_ != (code *)0x0) {
          (*(code *)local_f8._0_8_)(&local_108,&local_108,3);
        }
        break;
      case 2:
        local_108._8_8_ = (code **)0x0;
        local_108._M_unused._M_object = DMTextEncoder::EncodeChar;
        local_f8._8_8_ =
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_invoke;
        local_f8._0_8_ =
             std::
             _Function_handler<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::_M_manager;
        C40Encoder::EncodeC40
                  (&local_c8,
                   (function<int_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_108,2);
        if ((code *)local_f8._0_8_ != (code *)0x0) {
          (*(code *)local_f8._0_8_)(&local_108,&local_108,3);
        }
        break;
      case 3:
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_e8._M_string_length = 0;
        local_e8.field_2._M_local_buf[0] = '\0';
        do {
          if ((int)local_c8._msg._M_string_length - local_c8._skipAtEnd <= local_c8._pos) break;
          if (CONCAT44(local_c8._msg._M_string_length._4_4_,(int)local_c8._msg._M_string_length) <=
              (ulong)(long)local_c8._pos) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          }
          bVar3 = local_c8._msg._M_dataplus._M_p[local_c8._pos];
          local_c8._pos = local_c8._pos + 1;
          uVar16 = (uint)bVar3;
          if (bVar3 < 0x2a) {
            if ((uVar16 != 0xd) && (uVar16 != 0x20)) {
LAB_001571d6:
              if ((9 < bVar3 - 0x30) && (0x19 < bVar3 - 0x41)) {
                auVar24 = __cxa_allocate_exception(0x10);
                ToHexString_abi_cxx11_(&local_60,(DataMatrix *)(ulong)uVar16,auVar24._8_4_);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_108,"Illegal character: ",&local_60);
                std::invalid_argument::invalid_argument(auVar24._0_8_,(string *)&local_108);
                __cxa_throw(auVar24._0_8_,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
            }
          }
          else if ((bVar3 != 0x3e) && (uVar16 != 0x2a)) goto LAB_001571d6;
          std::__cxx11::string::push_back(cVar19);
          if (local_e8._M_string_length * -0x5555555555555555 < 0x5555555555555556) {
            C40Encoder::WriteNextTriplet(&local_c8,&local_e8);
            iVar9 = LookAheadTest(&local_c8._msg,(long)local_c8._pos,3);
            if (iVar9 == 3) goto LAB_00157256;
            local_c8._newEncoding = 0;
            iVar9 = 3;
          }
          else {
LAB_00157256:
            iVar9 = 0;
          }
        } while (iVar9 == 0);
        iVar9 = (int)local_c8._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                     .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
                (int)local_c8._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                     .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        pSVar10 = EncoderContext::updateSymbolInfo(&local_c8,iVar9);
        local_c8._pos = local_c8._pos - (int)local_e8._M_string_length;
        iVar17 = (int)local_c8._msg._M_string_length - (local_c8._pos + local_c8._skipAtEnd);
        if (((1 < iVar17) || (iVar9 = pSVar10->_dataCapacity - iVar9, 1 < iVar9)) ||
           (iVar17 != iVar9)) {
          EncoderContext::addCodeword(&local_c8,0xfe);
        }
        if (local_c8._newEncoding < 0) {
          local_c8._newEncoding = 0;
        }
        goto LAB_0015745e;
      case 4:
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_e8._M_string_length = 0;
        local_e8.field_2._M_local_buf[0] = '\0';
        do {
          if ((int)local_c8._msg._M_string_length - local_c8._skipAtEnd <= local_c8._pos) break;
          if (CONCAT44(local_c8._msg._M_string_length._4_4_,(int)local_c8._msg._M_string_length) <=
              (ulong)(long)local_c8._pos) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          }
          bVar3 = local_c8._msg._M_dataplus._M_p[local_c8._pos];
          if (((bVar3 & 0xffffffe0) != 0x20) && (0x1e < bVar3 - 0x40)) {
            auVar24 = __cxa_allocate_exception(0x10);
            ToHexString_abi_cxx11_(&local_60,(DataMatrix *)(ulong)bVar3,auVar24._8_4_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_108,"Illegal character: ",&local_60);
            std::invalid_argument::invalid_argument(auVar24._0_8_,(string *)&local_108);
            __cxa_throw(auVar24._0_8_,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          std::__cxx11::string::push_back(cVar19);
          local_c8._pos = local_c8._pos + 1;
          if (local_e8._M_string_length < 4) {
LAB_00156fe1:
            iVar17 = 0;
          }
          else {
            EdifactEncoder::EncodeToCodewords((ByteArray *)&local_108,&local_e8,startPos);
            uVar6 = local_108._8_8_;
            for (uVar15 = local_108._M_unused._0_8_; uVar15 != uVar6; uVar15 = uVar15 + 1) {
              EncoderContext::addCodeword(&local_c8,*(uint8_t *)uVar15);
            }
            std::__cxx11::string::erase((ulong)&local_e8,0);
            iVar9 = LookAheadTest(&local_c8._msg,(long)local_c8._pos,4);
            iVar17 = 0;
            if (iVar9 != 4) {
              local_c8._newEncoding = 0;
              iVar17 = 3;
            }
            if ((code **)local_108._M_unused._0_8_ != (code **)0x0) {
              operator_delete(local_108._M_unused._M_object,local_f8._0_8_ - local_108._0_8_);
            }
            if (iVar9 == 4) goto LAB_00156fe1;
          }
        } while (iVar17 == 0);
        std::__cxx11::string::push_back(cVar19);
        sVar8 = local_e8._M_string_length;
        if (local_e8._M_string_length != 0) {
          iVar9 = extraout_EDX;
          if (local_e8._M_string_length == 1) {
            iVar12 = (int)local_c8._codewords.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)local_c8._codewords.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            pSVar10 = EncoderContext::updateSymbolInfo(&local_c8,iVar12);
            iVar17 = pSVar10->_dataCapacity - iVar12;
            iVar22 = (int)local_c8._msg._M_string_length - (local_c8._skipAtEnd + local_c8._pos);
            iVar9 = extraout_EDX_00;
            if (iVar17 < iVar22) {
              pSVar10 = EncoderContext::updateSymbolInfo(&local_c8,iVar12 + 1);
              iVar17 = pSVar10->_dataCapacity - iVar12;
              iVar9 = extraout_EDX_01;
            }
            if ((iVar22 <= iVar17) && (iVar17 < 3)) goto LAB_0015745e;
          }
          if (4 < sVar8) {
            piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar11,"Count must not exceed 4");
            __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          local_38 = uVar14;
          EdifactEncoder::EncodeToCodewords((ByteArray *)&local_108,&local_e8,iVar9);
          iVar9 = (int)sVar8;
          bVar4 = local_c8._pos < (int)local_c8._msg._M_string_length - local_c8._skipAtEnd;
          if (iVar9 < 4) {
            iVar17 = (int)local_c8._codewords.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)local_c8._codewords.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            pSVar10 = EncoderContext::updateSymbolInfo(&local_c8,iVar9 + -1 + iVar17);
            if (pSVar10->_dataCapacity - iVar17 < 3) goto LAB_0015741c;
            EncoderContext::updateSymbolInfo(&local_c8,(local_108._8_4_ - local_108._0_4_) + iVar17)
            ;
            uVar15 = local_108._M_unused._0_8_;
            uVar6 = local_108._8_8_;
LAB_0015748f:
            for (; uVar15 != uVar6; uVar15 = (code **)(uVar15 + 1)) {
              EncoderContext::addCodeword(&local_c8,*(uint8_t *)uVar15);
            }
          }
          else {
LAB_0015741c:
            uVar15 = local_108._M_unused._0_8_;
            uVar6 = local_108._8_8_;
            if (3 < iVar9 || bVar4) goto LAB_0015748f;
            local_c8._symbolInfo = (SymbolInfo *)0x0;
            local_c8._pos = local_c8._pos - (iVar9 + -1);
          }
          if ((code **)local_108._M_unused._0_8_ != (code **)0x0) {
            operator_delete(local_108._M_unused._M_object,local_f8._0_8_ - local_108._0_8_);
          }
          local_c8._newEncoding = 0;
          uVar14 = local_38;
        }
LAB_0015745e:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        break;
      case 5:
        local_108._M_unused._M_object = local_f8;
        local_108._8_8_ = (code **)0x0;
        local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
        std::__cxx11::string::push_back((char)&local_108);
        do {
          if ((int)local_c8._msg._M_string_length - local_c8._skipAtEnd <= local_c8._pos)
          goto LAB_001573b7;
          if (CONCAT44(local_c8._msg._M_string_length._4_4_,(int)local_c8._msg._M_string_length) <=
              (ulong)(long)local_c8._pos) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          }
          std::__cxx11::string::push_back((char)&local_108);
          lVar18 = (long)local_c8._pos;
          local_c8._pos = (int)(lVar18 + 1U);
          iVar9 = LookAheadTest(&local_c8._msg,lVar18 + 1U,5);
        } while (iVar9 == 5);
        local_c8._newEncoding = 0;
LAB_001573b7:
        uVar7 = local_108._8_4_;
        iVar9 = ((int)local_c8._codewords.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (int)local_c8._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                     .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) + local_108._8_4_;
        pSVar10 = EncoderContext::updateSymbolInfo(&local_c8,iVar9);
        if ((iVar9 < pSVar10->_dataCapacity) ||
           (local_c8._pos < (int)local_c8._msg._M_string_length - local_c8._skipAtEnd)) {
          uVar16 = uVar7 - 1;
          if ((int)uVar7 < 0xfb) {
            if ((code **)local_108._8_8_ == (code **)0x0) {
LAB_0015792c:
              std::__throw_out_of_range_fmt
                        ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0);
            }
            *local_108._M_unused._M_function_pointer = (_func_void)(uint8_t)uVar16;
          }
          else {
            if (0x614 < (int)uVar7) {
              piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::__cxx11::to_string(&local_e8,uVar16);
              std::operator+(&local_60,"Message length not in valid ranges: ",&local_e8);
              std::invalid_argument::invalid_argument(piVar11,(string *)&local_60);
              __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            if ((code **)local_108._8_8_ == (code **)0x0) goto LAB_0015792c;
            *local_108._M_unused._M_function_pointer = (_func_void)((char)(uVar16 / 0xfa) + 0xf9);
            std::__cxx11::string::insert((ulong)&local_108,1,'\x01');
          }
        }
        uVar15 = local_108._8_8_;
        uVar6 = local_108._M_unused._0_8_;
        if ((code **)local_108._8_8_ != (code **)0x0) {
          ppcVar23 = (code **)0x0;
          do {
            iVar9 = ((int)local_c8._codewords.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (int)local_c8._codewords.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) * 0x95;
            iVar17 = (int)((ulong)((long)(iVar9 + 0x95) * -0x7f7f7f7f) >> 0x20) + iVar9 + 0x95;
            EncoderContext::addCodeword
                      (&local_c8,
                       *(uint8_t *)(uVar6 + (long)ppcVar23) +
                       (char)iVar9 + ((char)(iVar17 >> 7) - (char)(iVar17 >> 0x1f)) + -0x6a);
            ppcVar23 = (code **)((long)ppcVar23 + 1);
          } while ((code **)uVar15 != ppcVar23);
        }
        if ((undefined1 *)local_108._M_unused._0_8_ != local_f8) {
          operator_delete(local_108._M_unused._M_object,(ulong)(local_f8._0_8_ + 1));
        }
      }
      iVar9 = local_c8._newEncoding;
      if (-1 < local_c8._newEncoding) {
        local_c8._newEncoding = 0xffffffff;
        uVar14 = (ulong)(uint)iVar9;
      }
      uVar13 = CONCAT44(local_c8._msg._M_string_length._4_4_,(int)local_c8._msg._M_string_length);
    } while (local_c8._pos < (int)local_c8._msg._M_string_length - local_c8._skipAtEnd);
  }
  iVar17 = (int)local_c8._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
           (int)local_c8._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  pSVar10 = EncoderContext::updateSymbolInfo(&local_c8,iVar17);
  this = local_40;
  iVar9 = pSVar10->_dataCapacity;
  if ((iVar17 < iVar9) && ((5 < (uint)uVar14 || ((0x31U >> ((uint)uVar14 & 0x1f) & 1) == 0)))) {
    EncoderContext::addCodeword(&local_c8,0xfe);
  }
  if ((int)local_c8._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish -
      (int)local_c8._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start < iVar9) {
    EncoderContext::addCodeword(&local_c8,0x81);
  }
  while( true ) {
    if (iVar9 <= (int)local_c8._codewords.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)local_c8._codewords.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start) break;
    iVar17 = ((int)local_c8._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (int)local_c8._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start) * 0x95;
    iVar12 = iVar17 + 0x95;
    iVar17 = iVar17 + (int)((ulong)((long)iVar12 * -0x7e7b7257) >> 0x20) + 0x95;
    iVar12 = iVar12 + ((iVar17 >> 7) - (iVar17 >> 0x1f)) * -0xfd;
    EncoderContext::addCodeword(&local_c8,(char)iVar12 + -0x7e + (0x7c < iVar12) * '\x02');
  }
  (this->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            (this,CONCAT44(local_c8._codewords.
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish._4_4_,
                           (int)local_c8._codewords.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish) -
                  CONCAT44(local_c8._codewords.
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           (int)local_c8._codewords.
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start));
  __dest = (this->_M_impl).super__Vector_impl_data._M_start;
  __n = CONCAT44(local_c8._codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 (int)local_c8._codewords.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish) -
        (long)CONCAT44(local_c8._codewords.
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       (int)local_c8._codewords.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  if (__n != 0) {
    memmove(__dest,(void *)CONCAT44(local_c8._codewords.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)local_c8._codewords.
                                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         .
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start),__n);
  }
  (this->_M_impl).super__Vector_impl_data._M_finish = __dest + __n;
  pvVar5 = (void *)CONCAT44(local_c8._codewords.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)local_c8._codewords.
                                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_c8._codewords.
                                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._msg._M_dataplus._M_p != &local_c8._msg.field_2) {
    operator_delete(local_c8._msg._M_dataplus._M_p,local_c8._msg.field_2._M_allocated_capacity + 1);
  }
  return (ByteArray *)this;
}

Assistant:

ByteArray Encode(const std::wstring& msg, CharacterSet charset, SymbolShape shape, int minWidth, int minHeight, int maxWidth, int maxHeight)
{
	//the codewords 0..255 are encoded as Unicode characters
	//Encoder[] encoders = {
	//	new ASCIIEncoder(), new C40Encoder(), new TextEncoder(),
	//	new X12Encoder(), new EdifactEncoder(),  new Base256Encoder()
	//};

	if (charset == CharacterSet::Unknown) {
		charset = CharacterSet::ISO8859_1;
	}

	EncoderContext context(TextEncoder::FromUnicode(msg, charset));
	context.setSymbolShape(shape);
	context.setSizeConstraints(minWidth, minHeight, maxWidth, maxHeight);

	constexpr std::wstring_view MACRO_05_HEADER = L"[)>\x1E""05\x1D";
	constexpr std::wstring_view MACRO_06_HEADER = L"[)>\x1E""06\x1D";
	constexpr std::wstring_view MACRO_TRAILER = L"\x1E\x04";

	if (StartsWith(msg, MACRO_05_HEADER) && EndsWith(msg, MACRO_TRAILER)) {
		context.addCodeword(MACRO_05);
		context.setSkipAtEnd(2);
		context.setCurrentPos(Size(MACRO_05_HEADER));
	}
	else if (StartsWith(msg, MACRO_06_HEADER) && EndsWith(msg, MACRO_TRAILER)) {
		context.addCodeword(MACRO_06);
		context.setSkipAtEnd(2);
		context.setCurrentPos(Size(MACRO_06_HEADER));
	}

	int encodingMode = ASCII_ENCODATION; //Default mode
	while (context.hasMoreCharacters()) {
		switch (encodingMode) {
		case ASCII_ENCODATION:   ASCIIEncoder::EncodeASCII(context);     break;
		case C40_ENCODATION:     C40Encoder::EncodeC40(context);         break;
		case TEXT_ENCODATION:    DMTextEncoder::EncodeText(context);     break;
		case X12_ENCODATION:     X12Encoder::EncodeX12(context);         break;
		case EDIFACT_ENCODATION: EdifactEncoder::EncodeEdifact(context); break;
		case BASE256_ENCODATION: Base256Encoder::EncodeBase256(context); break;
		}
		if (context.newEncoding() >= 0) {
			encodingMode = context.newEncoding();
			context.clearNewEncoding();
		}
	}
	int len = context.codewordCount();
	auto symbolInfo = context.updateSymbolInfo(len);
	int capacity = symbolInfo->dataCapacity();
	if (len < capacity) {
		if (encodingMode != ASCII_ENCODATION && encodingMode != BASE256_ENCODATION && encodingMode != EDIFACT_ENCODATION) {
			context.addCodeword('\xfe'); //Unlatch (254)
		}
	}
	//Padding
	if (context.codewordCount() < capacity) {
		context.addCodeword(PAD);
	}
	while (context.codewordCount() < capacity) {
		context.addCodeword(Randomize253State(PAD, context.codewordCount() + 1));
	}

	return context.codewords();
}